

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrusive_list_column.h
# Opt level: O0

Intrusive_list_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false>_>_>
* __thiscall
Gudhi::persistence_matrix::
Intrusive_list_column<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)7,false,false,false>>>
::operator+=(Intrusive_list_column<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)7,false,false,false>>>
             *this,Intrusive_list_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false>_>_>
                   *column)

{
  Intrusive_list_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false>_>_>
  *column_local;
  Intrusive_list_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false>_>_>
  *this_local;
  
  _add<Gudhi::persistence_matrix::Intrusive_list_column<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)7,false,false,false>>>>
            (this,column);
  return (Intrusive_list_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false>_>_>
          *)this;
}

Assistant:

inline Intrusive_list_column<Master_matrix>& Intrusive_list_column<Master_matrix>::operator+=(const Entry_range& column)
{
  static_assert((!Master_matrix::isNonBasic || std::is_same_v<Entry_range, Intrusive_list_column>),
                "For boundary columns, the range has to be a column of same type to help ensure the validity of the "
                "base element.");  // could be removed, if we give the responsibility to the user.
  static_assert((!Master_matrix::isNonBasic || Master_matrix::Option_list::is_of_boundary_type),
                "For chain columns, the given column cannot be constant.");

  _add(column);

  return *this;
}